

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listmenu.cpp
# Opt level: O2

void __thiscall DListMenu::Ticker(DListMenu *this)

{
  uint i;
  ulong uVar1;
  
  DMenu::Ticker(&this->super_DMenu);
  uVar1 = 0;
  while( true ) {
    if ((this->mDesc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Count <= uVar1) break;
    (*(this->mDesc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Array[uVar1]->
      _vptr_FListMenuItem[3])();
    uVar1 = uVar1 + 1;
  }
  return;
}

Assistant:

void DListMenu::Ticker ()
{
	Super::Ticker();
	for(unsigned i=0;i<mDesc->mItems.Size(); i++)
	{
		mDesc->mItems[i]->Ticker();
	}
}